

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_database_window.cpp
# Opt level: O0

void ModelDbWindow::render(registry *p_reg)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  reference ppVar4;
  char *label;
  size_type sVar5;
  undefined8 uVar6;
  vector<Texture,_std::allocator<Texture>_> *this;
  const_reference pvVar7;
  ostream *poVar8;
  ImVec4 local_df8;
  ImVec4 local_de8;
  ImVec2 local_dd8;
  ImVec2 local_dd0;
  ImVec2 local_dc8;
  string local_dc0 [32];
  stringstream local_da0 [8];
  stringstream ostr_texture_size;
  undefined1 local_d90 [376];
  string local_c18 [32];
  stringstream local_bf8 [8];
  stringstream ostr_texture_type;
  ostream local_be8 [376];
  string local_a70 [32];
  stringstream local_a50 [8];
  stringstream ostr_texture_path;
  ostream local_a40 [376];
  string local_8c8 [32];
  stringstream local_8a8 [8];
  stringstream ostr_texture_gl_id;
  undefined1 local_898 [376];
  mapped_type *local_720;
  TextureInfo *texture_data;
  Texture *p_texture_id;
  const_iterator __end5;
  const_iterator __begin5;
  vector<Texture,_std::allocator<Texture>_> *__range5;
  stringstream local_6d8 [8];
  stringstream m_indices_ostr;
  undefined1 local_6c8 [376];
  string local_550 [32];
  stringstream local_530 [8];
  stringstream m_vertices_ostr;
  undefined1 local_520 [376];
  string local_3a8 [32];
  stringstream local_388 [8];
  stringstream vao_id_ostr;
  ostream local_378 [376];
  Mesh *local_200;
  Mesh *mesh;
  pair<const_unsigned_long,_Mesh> *mesh_iter;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<unsigned_long,_Mesh,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Mesh>_>_>
  *__range2_1;
  ostringstream modeldata_ostr;
  pair<const_unsigned_long,_ModelInfo> *p_modeldata_iter;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_ModelInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ModelInfo>_>_>
  *__range2;
  string local_38;
  ImVec2 local_18;
  registry *local_10;
  registry *p_reg_local;
  
  local_10 = p_reg;
  ImGui::Begin("Model Database",(bool *)0x0,0);
  bVar3 = ImGui::CollapsingHeader("Load Models",0);
  if (bVar3) {
    ImGui::InputText("path:",render::model_path_text,0x40,0,(ImGuiInputTextCallback)0x0,(void *)0x0)
    ;
    ImVec2::ImVec2(&local_18,0.0,0.0);
    bVar3 = ImGui::Button("Load Model",&local_18);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,render::model_path_text,
                 (allocator<char> *)((long)&__range2 + 7));
      ModelDb::add_model_job(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    }
  }
  bVar3 = ImGui::CollapsingHeader("Models List",0);
  if (bVar3) {
    __end2 = std::
             unordered_map<unsigned_long,_ModelInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ModelInfo>_>_>
             ::begin((unordered_map<unsigned_long,_ModelInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ModelInfo>_>_>
                      *)ModelDb::map);
    p_modeldata_iter =
         (pair<const_unsigned_long,_ModelInfo> *)
         std::
         unordered_map<unsigned_long,_ModelInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ModelInfo>_>_>
         ::end((unordered_map<unsigned_long,_ModelInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ModelInfo>_>_>
                *)ModelDb::map);
    while (bVar3 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_ModelInfo>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long,_ModelInfo>,_false>
                                *)&p_modeldata_iter), bVar3) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_ModelInfo>,_false,_false>::operator*
                         (&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2_1);
      poVar8 = (ostream *)std::ostream::operator<<(&__range2_1,ppVar4->first);
      std::operator<<(poVar8," : ");
      std::operator<<((ostream *)&__range2_1,(string *)&ppVar4->second);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2_1);
      std::__detail::_Node_iterator<std::pair<const_unsigned_long,_ModelInfo>,_false,_false>::
      operator++(&__end2);
    }
  }
  bVar3 = ImGui::CollapsingHeader("Meshes List",0);
  if (bVar3) {
    __end2_1 = std::
               unordered_map<unsigned_long,_Mesh,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Mesh>_>_>
               ::begin((unordered_map<unsigned_long,_Mesh,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Mesh>_>_>
                        *)MeshDb::map);
    mesh_iter = (pair<const_unsigned_long,_Mesh> *)
                std::
                unordered_map<unsigned_long,_Mesh,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Mesh>_>_>
                ::end((unordered_map<unsigned_long,_Mesh,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Mesh>_>_>
                       *)MeshDb::map);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_Mesh>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long,_Mesh>,_false> *)
                               &mesh_iter), bVar3) {
      mesh = (Mesh *)std::__detail::
                     _Node_iterator<std::pair<const_unsigned_long,_Mesh>,_false,_false>::operator*
                               (&__end2_1);
      local_200 = &((reference)mesh)->second;
      std::__cxx11::stringstream::stringstream(local_388);
      std::operator<<(local_378,"m_vao_id: ");
      std::ostream::operator<<(local_378,local_200->m_vao_id);
      std::__cxx11::stringstream::str();
      label = (char *)std::__cxx11::string::c_str();
      bVar3 = ImGui::TreeNode(label);
      std::__cxx11::string::~string(local_3a8);
      if (bVar3) {
        std::__cxx11::stringstream::stringstream(local_530);
        sVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&local_200->m_vertices);
        std::ostream::operator<<(local_520,sVar5);
        std::__cxx11::stringstream::str();
        uVar6 = std::__cxx11::string::c_str();
        ImGui::Text("vertices count: %s",uVar6);
        std::__cxx11::string::~string(local_550);
        std::__cxx11::stringstream::stringstream(local_6d8);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (&local_200->m_indices);
        std::ostream::operator<<(local_6c8,sVar5);
        std::__cxx11::stringstream::str();
        uVar6 = std::__cxx11::string::c_str();
        ImGui::Text("indices count: %s",uVar6);
        std::__cxx11::string::~string((string *)&__range5);
        bVar3 = ImGui::TreeNode("Textures:");
        if (bVar3) {
          this = &local_200->m_textures;
          __end5 = std::vector<Texture,_std::allocator<Texture>_>::begin(this);
          p_texture_id = (Texture *)std::vector<Texture,_std::allocator<Texture>_>::end(this);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                                             *)&p_texture_id), bVar3) {
            texture_data = (TextureInfo *)
                           __gnu_cxx::
                           __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                           ::operator*(&__end5);
            local_720 = std::
                        unordered_map<unsigned_int,_TextureInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>_>
                        ::at((unordered_map<unsigned_int,_TextureInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>_>
                              *)TextureDb::map,(key_type *)texture_data);
            std::__cxx11::stringstream::stringstream(local_8a8);
            std::ostream::operator<<(local_898,local_720->m_gl_id);
            std::__cxx11::stringstream::str();
            uVar6 = std::__cxx11::string::c_str();
            ImGui::Text("id: %s",uVar6);
            std::__cxx11::string::~string(local_8c8);
            std::__cxx11::stringstream::stringstream(local_a50);
            std::operator<<(local_a40,(string *)&local_720->m_path);
            std::__cxx11::stringstream::str();
            uVar6 = std::__cxx11::string::c_str();
            ImGui::Text("path: %s",uVar6);
            std::__cxx11::string::~string(local_a70);
            std::__cxx11::stringstream::stringstream(local_bf8);
            ::operator<<(local_be8,local_720->m_type);
            std::__cxx11::stringstream::str();
            uVar6 = std::__cxx11::string::c_str();
            ImGui::Text("type: %s",uVar6);
            std::__cxx11::string::~string(local_c18);
            std::__cxx11::stringstream::stringstream(local_da0);
            pvVar7 = std::array<int,_3UL>::operator[](&local_720->m_dimension,0);
            poVar8 = (ostream *)std::ostream::operator<<(local_d90,*pvVar7);
            poVar8 = std::operator<<(poVar8," ");
            pvVar7 = std::array<int,_3UL>::operator[](&local_720->m_dimension,1);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar7);
            poVar8 = std::operator<<(poVar8,", ");
            pvVar7 = std::array<int,_3UL>::operator[](&local_720->m_dimension,2);
            std::ostream::operator<<(poVar8,*pvVar7);
            std::__cxx11::stringstream::str();
            uVar6 = std::__cxx11::string::c_str();
            ImGui::Text("dimension: %s",uVar6);
            std::__cxx11::string::~string(local_dc0);
            uVar1 = local_720->m_gl_id;
            pvVar7 = std::array<int,_3UL>::operator[](&local_720->m_dimension,0);
            iVar2 = *pvVar7;
            pvVar7 = std::array<int,_3UL>::operator[](&local_720->m_dimension,1);
            ImVec2::ImVec2(&local_dc8,(float)iVar2,(float)*pvVar7);
            ImVec2::ImVec2(&local_dd0,0.0,0.0);
            ImVec2::ImVec2(&local_dd8,1.0,1.0);
            ImVec4::ImVec4(&local_de8,1.0,1.0,1.0,1.0);
            ImVec4::ImVec4(&local_df8,0.0,0.0,0.0,0.0);
            ImGui::Image((ImTextureID)(ulong)uVar1,&local_dc8,&local_dd0,&local_dd8,&local_de8,
                         &local_df8);
            std::__cxx11::stringstream::~stringstream(local_da0);
            std::__cxx11::stringstream::~stringstream(local_bf8);
            std::__cxx11::stringstream::~stringstream(local_a50);
            std::__cxx11::stringstream::~stringstream(local_8a8);
            __gnu_cxx::
            __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
            operator++(&__end5);
          }
          ImGui::TreePop();
        }
        ImGui::TreePop();
        std::__cxx11::stringstream::~stringstream(local_6d8);
        std::__cxx11::stringstream::~stringstream(local_530);
      }
      std::__cxx11::stringstream::~stringstream(local_388);
      std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Mesh>,_false,_false>::operator++
                (&__end2_1);
    }
  }
  ImGui::End();
  return;
}

Assistant:

void ModelDbWindow::render(
    entt::registry &p_reg) noexcept // We will use this to list users of ModelInfo
{
    ImGui::Begin("Model Database");
    if (ImGui::CollapsingHeader("Load Models"))
    {
        static char model_path_text[64] = "";
        ImGui::InputText("path:", model_path_text, 64);
        if (ImGui::Button("Load Model"))
        {
            ModelDb::add_model_job(
                std::string(model_path_text));
        }
    }
    if (ImGui::CollapsingHeader("Models List"))
    {
        for (const auto &p_modeldata_iter : ModelDb::map)
        {
            std::ostringstream modeldata_ostr;
            modeldata_ostr << p_modeldata_iter.first << " : ";
            modeldata_ostr << p_modeldata_iter.second.m_path;
        };
    }

    if (ImGui::CollapsingHeader("Meshes List"))
    {
        for (const std::pair<const std::size_t, Mesh> &mesh_iter : MeshDb::map)
        {
            const Mesh &mesh = mesh_iter.second;
            std::stringstream vao_id_ostr;
            vao_id_ostr << "m_vao_id: ";
            vao_id_ostr << mesh.m_vao_id;
            if (ImGui::TreeNode(vao_id_ostr.str().c_str()))
            {
                std::stringstream m_vertices_ostr;
                m_vertices_ostr << mesh.m_vertices.size();
                ImGui::Text("vertices count: %s", m_vertices_ostr.str().c_str());
                std::stringstream m_indices_ostr;
                m_indices_ostr << mesh.m_indices.size();
                ImGui::Text("indices count: %s", m_indices_ostr.str().c_str());
                if (ImGui::TreeNode("Textures:"))
                {
                    for (const Texture &p_texture_id : mesh.m_textures)
                    {
                        // TODO :: Refactor a bunch of this
                        const TextureInfo &texture_data = TextureDb::map.at(p_texture_id.m_gl_id);
                        std::stringstream ostr_texture_gl_id;
                        ostr_texture_gl_id << texture_data.m_gl_id;
                        ImGui::Text("id: %s", ostr_texture_gl_id.str().c_str());

                        std::stringstream ostr_texture_path;
                        ostr_texture_path << texture_data.m_path;
                        ImGui::Text("path: %s", ostr_texture_path.str().c_str());

                        std::stringstream ostr_texture_type;
                        ostr_texture_type << texture_data.m_type;
                        ImGui::Text("type: %s", ostr_texture_type.str().c_str());

                        std::stringstream ostr_texture_size;
                        ostr_texture_size << texture_data.m_dimension[0] << " " << texture_data.m_dimension[1] << ", " << texture_data.m_dimension[2];
                        ImGui::Text("dimension: %s", ostr_texture_size.str().c_str());

                        // TODO :: Figure out how to resize the image properly, maintaing its aspect ratio etc etc
                        ImGui::Image(
                            (ImTextureID)(intptr_t)texture_data.m_gl_id,
                            ImVec2(
                                static_cast<float>(texture_data.m_dimension[0]),
                                static_cast<float>(texture_data.m_dimension[1])));
                    };
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
        };
    }
    ImGui::End();
}